

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O1

int xmlSchemaComparePreserveReplaceStrings(xmlChar *x,xmlChar *y,int invert)

{
  byte bVar1;
  byte bVar2;
  byte *pbVar3;
  bool bVar4;
  
  bVar2 = *x;
  bVar4 = bVar2 == 0;
  if (!bVar4) {
    pbVar3 = x + 1;
    do {
      bVar1 = *y;
      if ((1 < bVar1 - 9) && (bVar1 != 0xd)) {
        if (bVar1 == 0) {
          if (bVar4) break;
        }
        else {
          if (bVar2 < bVar1) goto LAB_001b4622;
          if (bVar2 == bVar1) goto LAB_001b460e;
        }
LAB_001b4635:
        bVar4 = invert != 0;
        goto LAB_001b4639;
      }
      if (bVar2 != 0x20) {
        if (0x1f < bVar2) goto LAB_001b4635;
        goto LAB_001b4622;
      }
LAB_001b460e:
      y = y + 1;
      bVar2 = *pbVar3;
      pbVar3 = pbVar3 + 1;
      bVar4 = bVar2 == 0;
    } while (!bVar4);
  }
  if (*y == 0) {
    return 0;
  }
LAB_001b4622:
  bVar4 = invert == 0;
LAB_001b4639:
  return -(uint)bVar4 | 1;
}

Assistant:

static int
xmlSchemaComparePreserveReplaceStrings(const xmlChar *x,
				       const xmlChar *y,
				       int invert)
{
    int tmp;

    while ((*x != 0) && (*y != 0)) {
	if (IS_WSP_REPLACE_CH(*y)) {
	    if (! IS_WSP_SPACE_CH(*x)) {
		if ((*x - 0x20) < 0) {
		    if (invert)
			return(1);
		    else
			return(-1);
		} else {
		    if (invert)
			return(-1);
		    else
			return(1);
		}
	    }
	} else {
	    tmp = *x - *y;
	    if (tmp < 0) {
		if (invert)
		    return(1);
		else
		    return(-1);
	    }
	    if (tmp > 0) {
		if (invert)
		    return(-1);
		else
		    return(1);
	    }
	}
	x++;
	y++;
    }
    if (*x != 0) {
	if (invert)
	    return(-1);
	else
	    return(1);
    }
    if (*y != 0) {
	if (invert)
	    return(1);
	else
	    return(-1);
    }
    return(0);
}